

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O2

void __thiscall
TTD::SnapshotExtractor::EvacuateMarkedIntoSnapshot
          (SnapshotExtractor *this,ThreadContext *threadContext,
          BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *liveTopLevelBodies)

{
  ULONGLONG *topLevelEval_00;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *this_00;
  uint uVar1;
  SnapShot *this_01;
  ThreadContextTTD *this_02;
  ThreadContext *pTVar2;
  bool bVar3;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar4;
  ScriptContext **ppSVar5;
  Type *pTVar6;
  SnapContext *snapCtx;
  SlabAllocator *alloc;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *dictionary;
  UnorderedArrayList<int,_32UL> *this_03;
  int *piVar7;
  EntryType *pEVar8;
  ulong uVar9;
  SnapObject *sobj;
  FunctionBodyResolveInfo *fbInfo;
  SnapPrimitiveValue *snapValue;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *this_04;
  SnapRootInfoEntry *pSVar10;
  EntryType *pEVar11;
  unsigned_long origId;
  ScriptContext *pSVar12;
  MarkTableTag MVar13;
  int32 j;
  int iVar14;
  double dVar15;
  double dVar16;
  undefined1 auStack_148 [8];
  BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  objToLogIdMap;
  TTDTimer timer;
  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  topLevelEval;
  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  topLevelNewFunction;
  undefined1 local_88 [8];
  List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  topLevelScriptLoad;
  FunctionBody *local_48;
  FunctionBody *body;
  ThreadContext *local_38;
  
  objToLogIdMap.stats = (Type)0x0;
  timer.m_timer.data.cacheSysTime = -NAN;
  timer.m_timer.data.cacheTick = 0;
  dVar15 = PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)&objToLogIdMap.stats);
  this_01 = this->m_pendingSnap;
  topLevelScriptLoad._40_8_ = SnapShot::GetSnapshotSlabAllocator(this_01);
  auStack_148 = (undefined1  [8])0x0;
  objToLogIdMap.buckets = (Type)0x0;
  objToLogIdMap.entries = (Type)&Memory::HeapAllocator::Instance;
  objToLogIdMap.alloc = (Type)0x0;
  objToLogIdMap.size = 0;
  objToLogIdMap.count = 0;
  objToLogIdMap.freeList = 0x4b;
  objToLogIdMap.freeCount = 0;
  objToLogIdMap.modFunctionIndex = 0;
  local_38 = threadContext;
  ThreadContextTTD::LoadInvertedRootMap
            (threadContext->TTDContext,
             (BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)auStack_148);
  body = (FunctionBody *)0x0;
  topLevelEval_00 = &timer.m_timer.data.previousDifference;
  while (pLVar4 = ThreadContextTTD::GetTTDContexts(local_38->TTDContext),
        (int)body <
        (pLVar4->super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
        count) {
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._16_8_ = &Memory::HeapAllocator::Instance;
    local_88 = (undefined1  [8])&PTR_IsReadOnly_01385070;
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._vptr_ReadOnlyList = (_func_int **)0x0;
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .buffer._0_4_ = 0;
    topLevelEval._40_8_ = &PTR_IsReadOnly_01385070;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._16_8_ = &Memory::HeapAllocator::Instance;
    timer.m_timer.data.previousDifference = (ULONGLONG)&PTR_IsReadOnly_01385070;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    ._vptr_ReadOnlyList = (_func_int **)0x0;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .buffer._0_4_ = 0;
    topLevelScriptLoad.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .alloc = (Type)0x400000000;
    topLevelEval.
    super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
    .alloc = (Type)0x400000000;
    pLVar4 = ThreadContextTTD::GetTTDContexts(local_38->TTDContext);
    ppSVar5 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&pLVar4->
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   (int)body);
    ScriptContextTTD::GetLoadedSources
              ((*ppSVar5)->TTDContextInfo,
               (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)0x0,(List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_88,
               (List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)&topLevelEval.field_0x28,
               (List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)topLevelEval_00);
    for (iVar14 = 0;
        iVar14 < (int)topLevelScriptLoad.
                      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                      .buffer; iVar14 = iVar14 + 1) {
      pTVar6 = JsUtil::
               List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_88,iVar14);
      local_48 = (FunctionBody *)pTVar6->ContextSpecificBodyPtrId;
      bVar3 = MarkTable::IsMarked(&this->m_marks,local_48);
      if (bVar3) {
        JsUtil::
        BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add(liveTopLevelBodies,&local_48);
        MarkTable::ClearMark(&this->m_marks,local_48);
      }
    }
    for (iVar14 = 0; iVar14 < 0; iVar14 = iVar14 + 1) {
      pTVar6 = JsUtil::
               List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)&topLevelEval.field_0x28,iVar14);
      local_48 = (FunctionBody *)pTVar6->ContextSpecificBodyPtrId;
      bVar3 = MarkTable::IsMarked(&this->m_marks,local_48);
      if (bVar3) {
        JsUtil::
        BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add(liveTopLevelBodies,&local_48);
        MarkTable::ClearMark(&this->m_marks,local_48);
      }
    }
    for (iVar14 = 0;
        iVar14 < (int)topLevelEval.
                      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                      .buffer; iVar14 = iVar14 + 1) {
      pTVar6 = JsUtil::
               List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)topLevelEval_00,iVar14);
      local_48 = (FunctionBody *)pTVar6->ContextSpecificBodyPtrId;
      bVar3 = MarkTable::IsMarked(&this->m_marks,local_48);
      if (bVar3) {
        JsUtil::
        BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add(liveTopLevelBodies,&local_48);
        MarkTable::ClearMark(&this->m_marks,local_48);
      }
    }
    JsUtil::
    List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::~List((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)topLevelEval_00);
    JsUtil::
    List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::~List((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)&topLevelEval.field_0x28);
    JsUtil::
    List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::~List((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_88);
    body = (FunctionBody *)(ulong)((int)body + 1);
  }
  body = (FunctionBody *)SnapShot::GetContextList(this->m_pendingSnap);
  for (iVar14 = 0; pLVar4 = ThreadContextTTD::GetTTDContexts(local_38->TTDContext),
      iVar14 < (pLVar4->
               super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
               count; iVar14 = iVar14 + 1) {
    snapCtx = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry
                        ((UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *)body);
    pLVar4 = ThreadContextTTD::GetTTDContexts(local_38->TTDContext);
    ppSVar5 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&pLVar4->
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   iVar14);
    pSVar12 = *ppSVar5;
    alloc = SnapShot::GetSnapshotSlabAllocator(this_01);
    NSSnapValues::ExtractScriptContext
              (snapCtx,pSVar12,
               (BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)auStack_148,liveTopLevelBodies,alloc);
  }
  dictionary = ThreadContext::GetSymbolRegistrationMap_TTD(local_38);
  this_03 = SnapShot::GetTCSymbolMapInfoList(this->m_pendingSnap);
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_88,dictionary);
  while (bVar3 = JsUtil::
                 BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)local_88), bVar3) {
    piVar7 = UnorderedArrayList<int,_32UL>::NextOpenEntry(this_03);
    pEVar8 = JsUtil::
             BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::Current((IteratorBase<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        *)local_88);
    *piVar7 = ((pEVar8->
               super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               ).
               super_KeyValueEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
               .
               super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>_>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
               .value.ptr)->pid;
    JsUtil::
    BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_88);
  }
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Initialize
            (&this->m_idToHandlerMap,(this->m_marks).m_handlerCounts[1]);
  this_00 = &this->m_idToTypeMap;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Initialize
            (this_00,(this->m_marks).m_handlerCounts[2]);
  MarkTable::InitializeIter(&this->m_marks);
  uVar1 = (this->m_marks).m_iterPos;
  uVar9 = (ulong)uVar1;
  if (uVar1 < (this->m_marks).m_capcity) {
    MVar13 = (this->m_marks).m_markArray[uVar9];
  }
  else {
    MVar13 = Clear;
  }
  while (pTVar2 = local_38, MVar13 != Clear) {
    switch(MVar13 & AllKindMask) {
    case TypeHandlerTag:
      ExtractHandlerIfNeeded(this,(DynamicTypeHandler *)(this->m_marks).m_addrArray[uVar9],local_38)
      ;
      break;
    case TypeTag:
      ExtractTypeIfNeeded(this,(Type *)(this->m_marks).m_addrArray[uVar9],local_38);
      break;
    case PrimitiveObjectTag:
      ExtractTypeIfNeeded(this,*(Type **)((this->m_marks).m_addrArray[uVar9] + 8),local_38);
      snapValue = SnapShot::GetNextAvailablePrimitiveObjectEntry(this_01);
      uVar1 = (this->m_marks).m_iterPos;
      NSSnapValues::ExtractSnapPrimitiveValue
                (snapValue,(RecyclableObject *)(this->m_marks).m_addrArray[uVar1],
                 (bool)(((this->m_marks).m_markArray[uVar1] & JsWellKnownObj) >> 4),this_00,
                 (SlabAllocator *)topLevelScriptLoad._40_8_);
      break;
    case CompoundObjectTag:
      ExtractTypeIfNeeded(this,*(Type **)((this->m_marks).m_addrArray[uVar9] + 8),local_38);
      bVar3 = Js::VarIsImpl<Js::ScriptFunction>
                        ((RecyclableObject *)(this->m_marks).m_addrArray[(this->m_marks).m_iterPos])
      ;
      if (bVar3) {
        ExtractScriptFunctionEnvironmentIfNeeded
                  (this,(ScriptFunction *)(this->m_marks).m_addrArray[(this->m_marks).m_iterPos]);
      }
      sobj = SnapShot::GetNextAvailableCompoundObjectEntry(this_01);
      uVar1 = (this->m_marks).m_iterPos;
      NSSnapObjects::ExtractCompoundObject
                (sobj,(RecyclableObject *)(this->m_marks).m_addrArray[uVar1],
                 (bool)(((this->m_marks).m_markArray[uVar1] & JsWellKnownObj) >> 4),this_00,
                 (SlabAllocator *)topLevelScriptLoad._40_8_);
      break;
    case FunctionBodyTag:
      fbInfo = SnapShot::GetNextAvailableFunctionBodyResolveInfoEntry(this_01);
      uVar1 = (this->m_marks).m_iterPos;
      NSSnapValues::ExtractFunctionBodyInfo
                (fbInfo,(FunctionBody *)(this->m_marks).m_addrArray[uVar1],
                 (bool)(((this->m_marks).m_markArray[uVar1] & JsWellKnownObj) >> 4),
                 (SlabAllocator *)topLevelScriptLoad._40_8_);
      break;
    case EnvironmentTag:
    case SlotArrayTag:
      break;
    default:
      TTDAbort_unrecoverable_error("If this isn\'t true then we have an unknown tag");
    }
    MarkTable::MoveToNextAddress(&this->m_marks);
    uVar1 = (this->m_marks).m_iterPos;
    uVar9 = (ulong)uVar1;
    MVar13 = Clear;
    if (uVar1 < (this->m_marks).m_capcity) {
      MVar13 = (this->m_marks).m_markArray[uVar9];
    }
  }
  this_02 = local_38->TTDContext;
  this_04 = SnapShot::GetRootList(this->m_pendingSnap);
  JsUtil::
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_88,&pTVar2->TTDContext->m_ttdRootTagToObjectMap);
  while (bVar3 = JsUtil::
                 BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)local_88), bVar3) {
    pSVar10 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::NextOpenEntry
                        (this_04);
    pEVar11 = JsUtil::
              BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_88);
    pSVar10->LogObject =
         (TTD_PTR_ID)
         (pEVar11->
         super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         ).super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
         super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
         .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value;
    origId = JsUtil::
             BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::CurrentKey((IteratorBase<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_88);
    pSVar10->LogId = origId;
    bVar3 = ThreadContextTTD::ResolveIsLongLivedForExtract(this_02,origId);
    pSVar10->MaybeLongLivedRoot = bVar3;
    JsUtil::
    BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_88);
  }
  pSVar12 = ThreadContextTTD::GetActiveScriptContext(local_38->TTDContext);
  if (pSVar12 == (ScriptContext *)0x0) {
    SnapShot::SetActiveScriptContext(this->m_pendingSnap,0);
  }
  else {
    pSVar12 = ThreadContextTTD::GetActiveScriptContext(local_38->TTDContext);
    SnapShot::SetActiveScriptContext(this->m_pendingSnap,pSVar12->ScriptContextLogTag);
  }
  dVar16 = PlatformAgnostic::DateTime::HiResTimer::Now((HiResTimer *)&objToLogIdMap.stats);
  this_01->ExtractTime = (dVar16 - dVar15) / 1000.0;
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::RecyclableObject_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)auStack_148);
  return;
}

Assistant:

void SnapshotExtractor::EvacuateMarkedIntoSnapshot(ThreadContext* threadContext, JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator>& liveTopLevelBodies)
    {
        TTDTimer timer;
        double startTime = timer.Now();

        SnapShot* snap = this->m_pendingSnap;
        SlabAllocator& alloc = this->m_pendingSnap->GetSnapshotSlabAllocator();

        //invert the root map for extracting
        JsUtil::BaseDictionary<Js::RecyclableObject*, TTD_LOG_PTR_ID, HeapAllocator> objToLogIdMap(&HeapAllocator::Instance);
        threadContext->TTDContext->LoadInvertedRootMap(objToLogIdMap);

        //We extract all the global code function bodies with the context so clear their marks now
        for (int32 i = 0; i < threadContext->TTDContext->GetTTDContexts().Count(); ++i)
        {
            JsUtil::List<TopLevelFunctionInContextRelation, HeapAllocator> topLevelScriptLoad(&HeapAllocator::Instance);
            JsUtil::List<TopLevelFunctionInContextRelation, HeapAllocator> topLevelNewFunction(&HeapAllocator::Instance);
            JsUtil::List<TopLevelFunctionInContextRelation, HeapAllocator> topLevelEval(&HeapAllocator::Instance);

            Js::ScriptContext* ctx = threadContext->TTDContext->GetTTDContexts().Item(i);
            ctx->TTDContextInfo->GetLoadedSources(nullptr, topLevelScriptLoad, topLevelNewFunction, topLevelEval);

            for (int32 j = 0; j < topLevelScriptLoad.Count(); ++j)
            {
                Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(topLevelScriptLoad.Item(j).ContextSpecificBodyPtrId);
                if (this->m_marks.IsMarked(body))
                {
                    liveTopLevelBodies.Add(body);
                    this->m_marks.ClearMark(body);
                }
            }

            for (int32 j = 0; j < topLevelNewFunction.Count(); ++j)
            {
                Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(topLevelNewFunction.Item(j).ContextSpecificBodyPtrId);
                if (this->m_marks.IsMarked(body))
                {
                    liveTopLevelBodies.Add(body);
                    this->m_marks.ClearMark(body);
                }
            }

            for (int32 j = 0; j < topLevelEval.Count(); ++j)
            {
                Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(topLevelEval.Item(j).ContextSpecificBodyPtrId);
                if (this->m_marks.IsMarked(body))
                {
                    liveTopLevelBodies.Add(body);
                    this->m_marks.ClearMark(body);
                }
            }
        }

        UnorderedArrayList<NSSnapValues::SnapContext, TTD_ARRAY_LIST_SIZE_XSMALL>& snpCtxs = this->m_pendingSnap->GetContextList();
        for(int32 i = 0; i < threadContext->TTDContext->GetTTDContexts().Count(); ++i)
        {
            NSSnapValues::SnapContext* snpCtx = snpCtxs.NextOpenEntry();
            NSSnapValues::ExtractScriptContext(snpCtx, threadContext->TTDContext->GetTTDContexts().Item(i), objToLogIdMap, liveTopLevelBodies, snap->GetSnapshotSlabAllocator());
        }

        //extract the thread context symbol map info
        JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16>*, const Js::PropertyRecord*, Recycler, PowerOf2SizePolicy, Js::PropertyRecordStringHashComparer>* tcSymbolRegistrationMap = threadContext->GetSymbolRegistrationMap_TTD();
        UnorderedArrayList<Js::PropertyId, TTD_ARRAY_LIST_SIZE_XSMALL>& tcSymbolMapInfo = this->m_pendingSnap->GetTCSymbolMapInfoList();
        for(auto iter = tcSymbolRegistrationMap->GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::PropertyId* tcpid = tcSymbolMapInfo.NextOpenEntry();
            *tcpid = iter.CurrentValue()->GetPropertyId();
        }

        this->m_idToHandlerMap.Initialize(this->m_marks.GetCountForTag<MarkTableTag::TypeHandlerTag>());
        this->m_idToTypeMap.Initialize(this->m_marks.GetCountForTag<MarkTableTag::TypeTag>());

        //walk all the marked objects
        this->m_marks.InitializeIter();
        MarkTableTag tag = this->m_marks.GetTagValue();
        while(tag != MarkTableTag::Clear)
        {
            switch(tag & MarkTableTag::AllKindMask)
            {
            case MarkTableTag::TypeHandlerTag:
                this->ExtractHandlerIfNeeded(this->m_marks.GetPtrValue<Js::DynamicTypeHandler*>(), threadContext);
                break;
            case MarkTableTag::TypeTag:
                this->ExtractTypeIfNeeded(this->m_marks.GetPtrValue<Js::Type*>(), threadContext);
                break;
            case MarkTableTag::PrimitiveObjectTag:
            {
                this->ExtractTypeIfNeeded(this->m_marks.GetPtrValue<Js::RecyclableObject*>()->GetType(), threadContext);
                NSSnapValues::ExtractSnapPrimitiveValue(snap->GetNextAvailablePrimitiveObjectEntry(), this->m_marks.GetPtrValue<Js::RecyclableObject*>(), this->m_marks.GetTagValueIsWellKnown(), this->m_idToTypeMap, alloc);
                break;
            }
            case MarkTableTag::CompoundObjectTag:
            {
                this->ExtractTypeIfNeeded(this->m_marks.GetPtrValue<Js::RecyclableObject*>()->GetType(), threadContext);
                if(Js::VarIs<Js::ScriptFunction>(this->m_marks.GetPtrValue<Js::RecyclableObject*>()))
                {
                    this->ExtractScriptFunctionEnvironmentIfNeeded(this->m_marks.GetPtrValue<Js::ScriptFunction*>());
                }
                NSSnapObjects::ExtractCompoundObject(snap->GetNextAvailableCompoundObjectEntry(), this->m_marks.GetPtrValue<Js::RecyclableObject*>(), this->m_marks.GetTagValueIsWellKnown(), this->m_idToTypeMap, alloc);
                break;
            }
            case MarkTableTag::FunctionBodyTag:
                NSSnapValues::ExtractFunctionBodyInfo(snap->GetNextAvailableFunctionBodyResolveInfoEntry(), this->m_marks.GetPtrValue<Js::FunctionBody*>(), this->m_marks.GetTagValueIsWellKnown(), alloc);
                break;
            case MarkTableTag::EnvironmentTag:
            case MarkTableTag::SlotArrayTag:
                break; //should be handled with the associated script function
            default:
                TTDAssert(false, "If this isn't true then we have an unknown tag");
                break;
            }

            this->m_marks.MoveToNextAddress();
            tag = this->m_marks.GetTagValue();
        }

        //Extract the roots
        ThreadContextTTD* txctx = threadContext->TTDContext;
        UnorderedArrayList<NSSnapValues::SnapRootInfoEntry, TTD_ARRAY_LIST_SIZE_MID>& rootlist = this->m_pendingSnap->GetRootList();
        for(auto iter = threadContext->TTDContext->GetRootTagToObjectMap().GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* spe = rootlist.NextOpenEntry();
            spe->LogObject = TTD_CONVERT_VAR_TO_PTR_ID(iter.CurrentValue());
            spe->LogId = iter.CurrentKey();
            spe->MaybeLongLivedRoot = txctx->ResolveIsLongLivedForExtract(spe->LogId);
        }

        if(threadContext->TTDContext->GetActiveScriptContext() == nullptr)
        {
            this->m_pendingSnap->SetActiveScriptContext(TTD_INVALID_LOG_PTR_ID);
        }
        else
        {
            TTD_LOG_PTR_ID ctxId = threadContext->TTDContext->GetActiveScriptContext()->ScriptContextLogTag;
            this->m_pendingSnap->SetActiveScriptContext(ctxId);
        }

        double endTime = timer.Now();
        snap->ExtractTime = (endTime - startTime) / 1000.0;
    }